

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  long lVar1;
  Index IVar2;
  Index IVar3;
  long outer_00;
  long *plVar4;
  Index inner_2;
  Index inner_1;
  Index inner;
  Index alignedEnd;
  Index outer;
  Index alignedStart;
  Index alignedStep;
  Index outerSize;
  Index innerSize;
  Index packetAlignedMask;
  Scalar *dst_ptr;
  long local_78;
  long local_70;
  long local_68;
  long inner_00;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *this;
  long local_48;
  Index local_30 [2];
  Scalar *local_20;
  long *local_10;
  undefined1 *local_8;
  
  local_20 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
             ::dstDataPtr((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
                           *)0x146c53);
  local_30[1] = 1;
  local_30[0] = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
                ::innerSize((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
                             *)0x146c6b);
  IVar2 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
          ::outerSize((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
                       *)0x146c7a);
  IVar3 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
          ::outerStride((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
                         *)0x146c89);
  local_48 = 0;
  for (this = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)0x0; (long)this < IVar2;
      this = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
              *)((long)&this->m_dst + 1)) {
    outer_00 = local_48 + (local_30[0] - local_48 & 0xfffffffffffffffeU);
    for (inner_00 = 0; inner_00 < local_48; inner_00 = inner_00 + 1) {
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
      ::assignCoeffByOuterInner(this,outer_00,inner_00);
    }
    for (local_68 = local_48; lVar1 = outer_00, local_68 < outer_00; local_68 = local_68 + 2) {
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,30,4,false>>,Eigen::internal::assign_op<double,double>,0>
      ::assignPacketByOuterInner<16,0,double__vector(2)>(this,outer_00,inner_00);
    }
    while (local_70 = lVar1, local_70 < local_30[0]) {
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_30,_4,_false>_>,_Eigen::internal::assign_op<double,_double>,_0>
      ::assignCoeffByOuterInner(this,outer_00,inner_00);
      lVar1 = local_70 + 1;
    }
    local_78 = (long)(local_48 + (2U - IVar3 % 2 & 1)) % 2;
    local_10 = local_30;
    local_8 = (undefined1 *)&local_78;
    plVar4 = std::min<long>(&local_78,local_10);
    local_48 = *plVar4;
  }
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    typedef typename Kernel::Scalar Scalar;
    typedef typename Kernel::PacketType PacketType;
    enum {
      packetSize = unpacket_traits<PacketType>::size,
      requestedAlignment = int(Kernel::AssignmentTraits::InnerRequiredAlignment),
      alignable = packet_traits<Scalar>::AlignedOnScalar || int(Kernel::AssignmentTraits::DstAlignment)>=sizeof(Scalar),
      dstIsAligned = int(Kernel::AssignmentTraits::DstAlignment)>=int(requestedAlignment),
      dstAlignment = alignable ? int(requestedAlignment)
                               : int(Kernel::AssignmentTraits::DstAlignment)
    };
    const Scalar *dst_ptr = kernel.dstDataPtr();
    if((!bool(dstIsAligned)) && (UIntPtr(dst_ptr) % sizeof(Scalar))>0)
    {
      // the pointer is not aligend-on scalar, so alignment is not possible
      return dense_assignment_loop<Kernel,DefaultTraversal,NoUnrolling>::run(kernel);
    }
    const Index packetAlignedMask = packetSize - 1;
    const Index innerSize = kernel.innerSize();
    const Index outerSize = kernel.outerSize();
    const Index alignedStep = alignable ? (packetSize - kernel.outerStride() % packetSize) & packetAlignedMask : 0;
    Index alignedStart = ((!alignable) || bool(dstIsAligned)) ? 0 : internal::first_aligned<requestedAlignment>(dst_ptr, innerSize);

    for(Index outer = 0; outer < outerSize; ++outer)
    {
      const Index alignedEnd = alignedStart + ((innerSize-alignedStart) & ~packetAlignedMask);
      // do the non-vectorizable part of the assignment
      for(Index inner = 0; inner<alignedStart ; ++inner)
        kernel.assignCoeffByOuterInner(outer, inner);

      // do the vectorizable part of the assignment
      for(Index inner = alignedStart; inner<alignedEnd; inner+=packetSize)
        kernel.template assignPacketByOuterInner<dstAlignment, Unaligned, PacketType>(outer, inner);

      // do the non-vectorizable part of the assignment
      for(Index inner = alignedEnd; inner<innerSize ; ++inner)
        kernel.assignCoeffByOuterInner(outer, inner);

      alignedStart = numext::mini((alignedStart+alignedStep)%packetSize, innerSize);
    }
  }